

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O1

int main(int ac,char **av)

{
  char *pcVar1;
  bool bVar2;
  uint ac_00;
  int iVar3;
  int iVar4;
  char **av_00;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string config;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  CommandLineArguments args;
  allocator local_3b1;
  undefined8 local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  string local_368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  char *local_328;
  ulong local_320;
  string local_318;
  CommandLineArguments local_2f8;
  undefined1 local_2e0 [688];
  
  cmsys::Encoding::CommandLineArguments::Main(&local_2f8,ac,av);
  ac_00 = cmsys::Encoding::CommandLineArguments::argc(&local_2f8);
  av_00 = cmsys::Encoding::CommandLineArguments::argv(&local_2f8);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(*av_00);
  if (1 < (int)ac_00) {
    pcVar1 = av_00[1];
    iVar3 = strcmp(pcVar1,"--build");
    if (iVar3 == 0) {
      local_3a8._M_allocated_capacity = (size_type)&local_398;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
      local_388._M_allocated_capacity = (size_type)&local_378;
      local_378._M_allocated_capacity._0_4_ = 0x75626544;
      local_378._M_allocated_capacity._4_2_ = 0x67;
      local_388._8_8_ = 5;
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      local_368._M_string_length = 0;
      local_368.field_2._M_local_buf[0] = '\0';
      local_3b0 = 0;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (ac_00 != 2) {
        local_320 = (ulong)ac_00;
        iVar3 = 1;
        uVar8 = 2;
        local_3b0 = 0;
        do {
          if (iVar3 == 4) {
            std::__cxx11::string::string((string *)local_2e0,av_00[uVar8],(allocator *)&local_318);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_348,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e0);
            if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
              operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
            }
LAB_00222531:
            iVar3 = 4;
          }
          else {
            pcVar1 = av_00[uVar8];
            iVar4 = strcmp(pcVar1,"--target");
            if (iVar4 == 0) {
              iVar3 = 2;
            }
            else {
              iVar4 = strcmp(pcVar1,"--config");
              if (iVar4 == 0) {
                iVar3 = 3;
              }
              else {
                iVar4 = strcmp(pcVar1,"--clean-first");
                iVar7 = 0;
                if (iVar4 == 0) {
                  local_3b0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
                  iVar3 = iVar7;
                }
                else {
                  iVar4 = strcmp(pcVar1,"--use-stderr");
                  if (iVar4 != 0) {
                    iVar4 = strcmp(pcVar1,"--");
                    if (iVar4 == 0) goto LAB_00222531;
                    if (iVar3 == 3) {
                      paVar5 = &local_388;
                    }
                    else {
                      paVar5 = &local_3a8;
                      if (iVar3 != 2) {
                        if (iVar3 == 1) {
                          std::__cxx11::string::string((string *)&local_318,pcVar1,&local_3b1);
                          cmsys::SystemTools::CollapseFullPath((string *)local_2e0,&local_318);
                          std::__cxx11::string::operator=((string *)&local_368,(string *)local_2e0);
                          if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
                            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                          }
                          iVar3 = iVar7;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_318._M_dataplus._M_p != &local_318.field_2) {
                            operator_delete(local_318._M_dataplus._M_p,
                                            local_318.field_2._M_allocated_capacity + 1);
                          }
                        }
                        else {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"Unknown argument ",0x11);
                          pcVar1 = av_00[uVar8];
                          if (pcVar1 == (char *)0x0) {
                            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x5d9bc0);
                          }
                          else {
                            sVar6 = strlen(pcVar1);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,pcVar1,sVar6);
                          }
                          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
                          std::ostream::put(-0x40);
                          std::ostream::flush();
                          std::__cxx11::string::_M_replace
                                    ((ulong)&local_368,0,(char *)local_368._M_string_length,0x512e03
                                    );
                        }
                        goto LAB_0022276d;
                      }
                    }
                    local_328 = (char *)(&paVar5->_M_allocated_capacity)[1];
                    strlen(pcVar1);
                    std::__cxx11::string::_M_replace((ulong)paVar5,0,local_328,(ulong)pcVar1);
                    iVar3 = 0;
                  }
                }
              }
            }
          }
LAB_0022276d:
          uVar8 = uVar8 + 1;
        } while (local_320 != uVar8);
      }
      if ((char *)local_368._M_string_length == (char *)0x0) {
        iVar3 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --target <tgt> = Build <tgt> instead of default targets.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n  --use-stderr   = Ignored.  Behavior is default in CMake >= 3.0.\n  --             = Pass remaining options to the native tool.\n"
                   ,0x1ed);
      }
      else {
        bVar2 = cmsys::SystemTools::StringStartsWith((char *)local_388._M_allocated_capacity,".\\");
        if (bVar2) {
          std::__cxx11::string::substr((ulong)local_2e0,(ulong)&local_388);
          std::__cxx11::string::operator=((string *)local_388._M_local_buf,(string *)local_2e0);
          if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
          }
        }
        cmake::cmake((cmake *)local_2e0);
        iVar3 = cmake::Build((cmake *)local_2e0,&local_368,(string *)&local_3a8,(string *)&local_388
                             ,&local_348,(bool)((byte)local_3b0 & 1));
        cmake::~cmake((cmake *)local_2e0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,
                        CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                                 local_368.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_allocated_capacity != &local_378) {
        operator_delete((void *)local_388._M_allocated_capacity,
                        CONCAT26(local_378._M_allocated_capacity._6_2_,
                                 CONCAT24(local_378._M_allocated_capacity._4_2_,
                                          local_378._M_allocated_capacity._0_4_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_allocated_capacity != &local_398) {
        operator_delete((void *)local_3a8._M_allocated_capacity,local_398._M_allocated_capacity + 1)
        ;
      }
      goto LAB_00222430;
    }
    iVar3 = strcmp(pcVar1,"-E");
    if (iVar3 == 0) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3a8,(ulong)(ac_00 - 1));
      std::__cxx11::string::string((string *)local_2e0,*av_00,(allocator *)local_388._M_local_buf);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_3a8._M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0);
      if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
        operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<char_const*const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3a8,
                 local_3a8._8_8_,av_00 + 2,av_00 + ac_00);
      iVar3 = cmcmd::ExecuteCMakeCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_3a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3a8);
      goto LAB_00222430;
    }
  }
  iVar3 = do_cmake(ac_00,av_00);
  cmDynamicLoader::FlushCache();
LAB_00222430:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_2f8);
  return iVar3;
}

Assistant:

int main(int ac, char const* const* av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(av[0]);
  if(ac > 1)
    {
    if(strcmp(av[1], "--build") == 0)
      {
      return do_build(ac, av);
      }
    else if(strcmp(av[1], "-E") == 0)
      {
      return do_command(ac, av);
      }
    }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  return ret;
}